

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitAggState<signed_char>,signed_char,duckdb::BitStringAggOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  data_ptr_t pdVar1;
  ulong uVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  ulong uVar9;
  data_ptr_t input_00;
  unsigned_long *puVar10;
  idx_t iVar11;
  unsigned_long *puVar12;
  unsigned_long *puVar13;
  AggregateUnaryInput input_data;
  AggregateUnaryInput local_90;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    FlatVector::VerifyFlatVector(input);
    local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      puVar10 = (unsigned_long *)0x0;
      uVar9 = 0;
      puVar12 = (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      local_78.data = (data_ptr_t)&input->validity;
      do {
        puVar13 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar13 == (unsigned_long *)0x0) {
          puVar13 = puVar12 + 8;
          if (count <= puVar12 + 8) {
            puVar13 = (unsigned_long *)count;
          }
joined_r0x019cd5c5:
          while (puVar8 = puVar10, puVar5 = puVar10,
                puVar6 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask,
                puVar10 < puVar13) {
            BitStringAggOperation::
            Operation<signed_char,duckdb::BitAggState<signed_char>,duckdb::BitStringAggOperation>
                      ((BitAggState<signed_char> *)state,(char *)((long)puVar10 + (long)pdVar1),
                       (AggregateUnaryInput *)&local_78);
            puVar10 = (unsigned_long *)
                      ((long)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_mask + 1);
            local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar10;
          }
        }
        else {
          uVar2 = puVar13[uVar9];
          puVar13 = puVar12 + 8;
          if (count <= puVar12 + 8) {
            puVar13 = (unsigned_long *)count;
          }
          if (uVar2 == 0xffffffffffffffff) goto joined_r0x019cd5c5;
          puVar8 = puVar13;
          puVar5 = puVar13;
          puVar6 = puVar13;
          puVar7 = puVar12;
          puVar4 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (uVar2 != 0) {
            while (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                        puVar7,
                  puVar8 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask, puVar5 = puVar10, puVar6 = puVar4,
                  local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask <
                  puVar13) {
              if ((uVar2 >> ((ulong)(uint)((int)local_78.validity.
                                                super_TemplatedValidityMask<unsigned_long>.
                                                validity_mask - (int)puVar12) & 0x3f) & 1) != 0) {
                input_00 = (data_ptr_t)
                           ((long)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask + (long)pdVar1);
                local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
                BitStringAggOperation::
                Operation<signed_char,duckdb::BitAggState<signed_char>,duckdb::BitStringAggOperation>
                          ((BitAggState<signed_char> *)state,(char *)input_00,
                           (AggregateUnaryInput *)&local_78);
              }
              puVar10 = (unsigned_long *)
                        ((long)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask + 1);
              puVar4 = puVar10;
              puVar7 = puVar10;
            }
          }
        }
        local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar6;
        puVar10 = puVar5;
        uVar9 = uVar9 + 1;
        puVar12 = puVar8;
      } while (uVar9 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar10 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar10 == (unsigned_long *)0x0) || ((*puVar10 & 1) != 0)) {
      local_78.data = (data_ptr_t)&input->validity;
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      BitStringAggOperation::
      Operation<signed_char,duckdb::BitAggState<signed_char>,duckdb::BitStringAggOperation>
                ((BitAggState<signed_char> *)state,(char *)input->data,
                 (AggregateUnaryInput *)&local_78);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    local_90.input_mask = &local_78.validity;
    local_90.input = aggr_input_data;
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar3 = (local_78.sel)->sel_vector;
        iVar11 = 0;
        do {
          local_90.input_idx = iVar11;
          if (psVar3 != (sel_t *)0x0) {
            local_90.input_idx = (idx_t)psVar3[iVar11];
          }
          BitStringAggOperation::
          Operation<signed_char,duckdb::BitAggState<signed_char>,duckdb::BitStringAggOperation>
                    ((BitAggState<signed_char> *)state,(char *)(local_78.data + local_90.input_idx),
                     &local_90);
          iVar11 = iVar11 + 1;
        } while (count != iVar11);
      }
    }
    else if (count != 0) {
      psVar3 = (local_78.sel)->sel_vector;
      iVar11 = 0;
      do {
        local_90.input_idx = iVar11;
        if (psVar3 != (sel_t *)0x0) {
          local_90.input_idx = (idx_t)psVar3[iVar11];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [local_90.input_idx >> 6] >> (local_90.input_idx & 0x3f) & 1) != 0)) {
          BitStringAggOperation::
          Operation<signed_char,duckdb::BitAggState<signed_char>,duckdb::BitStringAggOperation>
                    ((BitAggState<signed_char> *)state,(char *)(local_78.data + local_90.input_idx),
                     &local_90);
        }
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}